

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh_key_clone.c
# Opt level: O3

ssh_key * ssh_key_clone(ssh_key *key)

{
  ptrlen pVar1;
  ptrlen pVar2;
  ptrlen pVar3;
  _Bool _Var4;
  strbuf *buf_o;
  strbuf *buf_o_00;
  ssh_key *psVar5;
  
  buf_o = strbuf_new_nm();
  (*key->vt->public_blob)(key,buf_o->binarysink_);
  _Var4 = (*key->vt->has_private)(key);
  if (_Var4) {
    buf_o_00 = strbuf_new_nm();
    (*key->vt->private_blob)(key,buf_o_00->binarysink_);
    pVar1.ptr = buf_o->u;
    pVar1.len = buf_o->len;
    pVar2.ptr = buf_o_00->u;
    pVar2.len = buf_o_00->len;
    psVar5 = (*key->vt->new_priv)(key->vt,pVar1,pVar2);
    strbuf_free(buf_o_00);
  }
  else {
    pVar3.ptr = buf_o->u;
    pVar3.len = buf_o->len;
    psVar5 = (*key->vt->new_pub)(key->vt,pVar3);
  }
  strbuf_free(buf_o);
  return psVar5;
}

Assistant:

ssh_key *ssh_key_clone(ssh_key *key)
{
    /*
     * To avoid having to add a special method in the vtable API, we
     * clone by round-tripping through public and private blobs.
     */
    strbuf *pub = strbuf_new_nm();
    ssh_key_public_blob(key, BinarySink_UPCAST(pub));

    ssh_key *copy;

    if (ssh_key_has_private(key)) {
        strbuf *priv = strbuf_new_nm();
        ssh_key_private_blob(key, BinarySink_UPCAST(priv));
        copy = ssh_key_new_priv(ssh_key_alg(key), ptrlen_from_strbuf(pub),
                                ptrlen_from_strbuf(priv));
        strbuf_free(priv);
    } else {
        copy = ssh_key_new_pub(ssh_key_alg(key), ptrlen_from_strbuf(pub));
    }

    strbuf_free(pub);
    return copy;
}